

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O0

CMyString * SubString(CMyString *__return_storage_ptr__,CMyString *CS,int pos,int len)

{
  CMyString *CS_00;
  CMyString *tmpStr;
  int rlen;
  int len_local;
  int pos_local;
  CMyString *CS_local;
  
  CS_00 = (CMyString *)malloc(0x408);
  InitCMyString(CS_00," ");
  tmpStr._4_4_ = len;
  if (CS->length < pos + len) {
    tmpStr._4_4_ = CS->length - pos;
  }
  memcpy(CS_00->str,CS->str + pos,(long)tmpStr._4_4_);
  CS_00->length = tmpStr._4_4_;
  CS_00->str[CS_00->length] = '\0';
  memcpy(__return_storage_ptr__,CS_00,0x408);
  return __return_storage_ptr__;
}

Assistant:

CMyString SubString(CMyString *CS,const int pos,const int len)  //提取一个从pos位置起长度为len的子串
{
    int rlen = len;
    CMyString *tmpStr = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmpStr,(char *)" ");
    if(pos+len > CS->length)
        rlen = CS->length-pos;
    memcpy(tmpStr->str,CS->str+pos,rlen);
    tmpStr->length = rlen;
    tmpStr->str[tmpStr->length] = 0;
    return *tmpStr;
}